

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O0

int __thiscall
btAlignedObjectArray<btQuaternion>::copy
          (btAlignedObjectArray<btQuaternion> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  btQuaternion *pbVar1;
  undefined8 *puVar2;
  long in_RCX;
  int i;
  btQuaternion *dest_local;
  int end_local;
  int start_local;
  btAlignedObjectArray<btQuaternion> *this_local;
  
  for (i = (int)dst; i < (int)src; i = i + 1) {
    puVar2 = (undefined8 *)(in_RCX + (long)i * 0x10);
    pbVar1 = this->m_data;
    *puVar2 = *(undefined8 *)pbVar1[i].super_btQuadWord.m_floats;
    puVar2[1] = *(undefined8 *)(pbVar1[i].super_btQuadWord.m_floats + 2);
  }
  return i;
}

Assistant:

SIMD_FORCE_INLINE	void	copy(int start,int end, T* dest) const
		{
			int i;
			for (i=start;i<end;++i)
#ifdef BT_USE_PLACEMENT_NEW
				new (&dest[i]) T(m_data[i]);
#else
				dest[i] = m_data[i];
#endif //BT_USE_PLACEMENT_NEW
		}